

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alsa.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_239414::AlsaCapture::stop(AlsaCapture *this)

{
  FILE *__stream;
  ALCuint samples;
  int iVar1;
  size_type __n;
  undefined8 uVar2;
  vector<al::byte> temp;
  allocator_type local_31;
  _Vector_base<al::byte,_al::allocator<al::byte,_1UL>_> local_30;
  
  samples = availableSamples(this);
  if ((samples != 0) &&
     ((this->mRing)._M_t.super___uniq_ptr_impl<RingBuffer,_std::default_delete<RingBuffer>_>._M_t.
      super__Tuple_impl<0UL,_RingBuffer_*,_std::default_delete<RingBuffer>_>.
      super__Head_base<0UL,_RingBuffer_*,_false>._M_head_impl == (RingBuffer *)0x0)) {
    __n = (*(anonymous_namespace)::psnd_pcm_frames_to_bytes)(this->mPcmHandle,samples);
    std::vector<al::byte,_al::allocator<al::byte,_1UL>_>::vector
              ((vector<al::byte,_al::allocator<al::byte,_1UL>_> *)&local_30,__n,&local_31);
    captureSamples(this,local_30._M_impl.super__Vector_impl_data._M_start,samples);
    std::vector<al::byte,_al::allocator<al::byte,_1UL>_>::_M_move_assign(&this->mBuffer,&local_30);
    std::_Vector_base<al::byte,_al::allocator<al::byte,_1UL>_>::~_Vector_base(&local_30);
  }
  iVar1 = (*(anonymous_namespace)::psnd_pcm_drop)(this->mPcmHandle);
  __stream = gLogFile;
  if ((iVar1 < 0) && (0 < (int)gLogLevel)) {
    uVar2 = (*(anonymous_namespace)::psnd_strerror)(iVar1);
    fprintf((FILE *)__stream,"[ALSOFT] (EE) drop failed: %s\n",uVar2);
  }
  this->mDoCapture = false;
  return;
}

Assistant:

void AlsaCapture::stop()
{
    /* OpenAL requires access to unread audio after stopping, but ALSA's
     * snd_pcm_drain is unreliable and snd_pcm_drop drops it. Capture what's
     * available now so it'll be available later after the drop.
     */
    ALCuint avail{availableSamples()};
    if(!mRing && avail > 0)
    {
        /* The ring buffer implicitly captures when checking availability.
         * Direct access needs to explicitly capture it into temp storage. */
        auto temp = al::vector<al::byte>(
            static_cast<size_t>(snd_pcm_frames_to_bytes(mPcmHandle, avail)));
        captureSamples(temp.data(), avail);
        mBuffer = std::move(temp);
    }
    int err{snd_pcm_drop(mPcmHandle)};
    if(err < 0)
        ERR("drop failed: %s\n", snd_strerror(err));
    mDoCapture = false;
}